

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

bool gflags::GetCommandLineFlagInfo(char *name,CommandLineFlagInfo *OUTPUT)

{
  FlagRegistry *this;
  CommandLineFlag *this_00;
  bool bVar1;
  
  if (name == (char *)0x0) {
    bVar1 = false;
  }
  else {
    this = anon_unknown_2::FlagRegistry::GlobalRegistry();
    gflags_mutex_namespace::Mutex::Lock(&this->lock_);
    this_00 = anon_unknown_2::FlagRegistry::FindFlagLocked(this,name);
    bVar1 = this_00 != (CommandLineFlag *)0x0;
    if (bVar1) {
      if (OUTPUT == (CommandLineFlagInfo *)0x0) {
        __assert_fail("OUTPUT",
                      "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/gflags.cc"
                      ,0x658,
                      "bool gflags::GetCommandLineFlagInfo(const char *, CommandLineFlagInfo *)");
      }
      anon_unknown_2::CommandLineFlag::FillCommandLineFlagInfo(this_00,OUTPUT);
    }
    gflags_mutex_namespace::Mutex::Unlock(&this->lock_);
  }
  return bVar1;
}

Assistant:

bool GetCommandLineFlagInfo(const char* name, CommandLineFlagInfo* OUTPUT) {
  if (NULL == name) return false;
  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  FlagRegistryLock frl(registry);
  CommandLineFlag* flag = registry->FindFlagLocked(name);
  if (flag == NULL) {
    return false;
  } else {
    assert(OUTPUT);
    flag->FillCommandLineFlagInfo(OUTPUT);
    return true;
  }
}